

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O0

void __thiscall adios2::transport::FileFStream::SeekToBegin(FileFStream *this)

{
  long in_RDI;
  string *in_stack_00000038;
  FileFStream *in_stack_00000040;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_48 [32];
  string local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  FileFStream *in_stack_fffffffffffffff0;
  
  WaitForOpen(in_stack_fffffffffffffff0);
  std::ostream::seekp(in_RDI + 0x100,_S_beg);
  __rhs = local_48;
  std::operator+(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::operator+(in_stack_ffffffffffffffa8,(char *)__rhs);
  CheckFile(in_stack_00000040,in_stack_00000038);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void FileFStream::SeekToBegin()
{
    WaitForOpen();
    m_FileStream.seekp(0, std::ios_base::beg);
    CheckFile("couldn't move to the beginning of file " + m_Name + ", in call to fstream seekp");
}